

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

void __thiscall glcts::anon_unknown_0::TGBase::TGBase(TGBase *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  PixelFormat *pPVar3;
  TGBase *this_local;
  
  deqp::SubcaseBase::SubcaseBase(&this->super_SubcaseBase);
  (this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper = (_func_int **)&PTR__TGBase_0325de88;
  pRVar2 = deqp::Context::getRenderContext((this->super_SubcaseBase).super_GLWrapper.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[4])();
  this->renderTarget = (RenderTarget *)CONCAT44(extraout_var,iVar1);
  pPVar3 = tcu::RenderTarget::getPixelFormat(this->renderTarget);
  this->pixelFormat = pPVar3;
  return;
}

Assistant:

TGBase() : renderTarget(m_context.getRenderContext().getRenderTarget()), pixelFormat(renderTarget.getPixelFormat())
	{
	}